

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O0

int oonf_cfg_apply(void)

{
  cfg_db *pcVar1;
  int iVar2;
  int local_114;
  undefined1 local_110 [4];
  int result;
  autobuf log;
  cfg_db *old_db;
  cfg_db *dst_1;
  cfg_db *local_28;
  cfg_db *dst;
  cfg_db *local_10;
  
  iVar2 = abuf_init((autobuf *)local_110);
  if (iVar2 == 0) {
    if ((log_global_mask[3] & 2) != 0) {
      oonf_log(LOG_SEVERITY_INFO,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x15e,(void *)0x0,0,
               "Apply configuration");
    }
    local_114 = -1;
    log._error = false;
    log._25_7_ = 0;
    iVar2 = oonf_cfg_update_globalcfg(true);
    if (iVar2 == 0) {
      iVar2 = oonf_cfg_load_subsystems();
      if (iVar2 == 0) {
        iVar2 = cfg_schema_validate(_oonf_raw_db,false,(_Bool)((config_global.failfast ^ 0xffU) & 1)
                                    ,(autobuf *)local_110);
        pcVar1 = _oonf_raw_db;
        if (iVar2 == 0) {
          log._24_8_ = _oonf_work_db;
          local_10 = cfg_db_add();
          if ((local_10 != (cfg_db *)0x0) &&
             (iVar2 = _cfg_db_append(local_10,pcVar1,(char *)0x0,(char *)0x0,(char *)0x0),
             iVar2 != 0)) {
            cfg_db_remove(local_10);
            local_10 = (cfg_db *)0x0;
          }
          _oonf_work_db = local_10;
          if (local_10 == (cfg_db *)0x0) {
            if ((log_global_mask[3] & 4) != 0) {
              oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x17a,(void *)0x0,0,
                       "Not enough memory for duplicating work db");
            }
            _oonf_work_db = (cfg_db *)log._24_8_;
            log._error = false;
            log._25_7_ = 0;
          }
          else {
            local_10->schema = &_oonf_schema;
            cfg_schema_validate(_oonf_work_db,true,false,(autobuf *)0x0);
            iVar2 = oonf_cfg_update_globalcfg(false);
            if (iVar2 == 0) {
              if ((_first_apply & 1U) == 0) {
                iVar2 = cfg_schema_handle_db_changes((cfg_db *)log._24_8_,_oonf_work_db);
                if ((iVar2 != 0) && ((log_global_mask[3] & 4) != 0)) {
                  oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x195,(void *)0x0,0
                           ,"Handling changes failes");
                }
              }
              else {
                iVar2 = cfg_schema_handle_db_startup_changes(_oonf_work_db);
                if ((iVar2 != 0) && ((log_global_mask[3] & 4) != 0)) {
                  oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",399,(void *)0x0,0,
                           "Handling changes failes");
                }
                _first_apply = false;
              }
              local_114 = 0;
              _trigger_reload = false;
              _trigger_commit = false;
              cfg_db_remove(_oonf_raw_db);
              pcVar1 = _oonf_work_db;
              local_28 = cfg_db_add();
              if ((local_28 != (cfg_db *)0x0) &&
                 (iVar2 = _cfg_db_append(local_28,pcVar1,(char *)0x0,(char *)0x0,(char *)0x0),
                 iVar2 != 0)) {
                cfg_db_remove(local_28);
                local_28 = (cfg_db *)0x0;
              }
              _oonf_raw_db = local_28;
              local_28->schema = &_oonf_schema;
            }
            else if ((log_global_mask[3] & 4) != 0) {
              oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x188,(void *)0x0,0,
                       "Updating global config failed");
            }
          }
        }
        else if ((log_global_mask[3] & 4) != 0) {
          oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x170,(void *)0x0,0,
                   "Configuration validation failed: %s",log._len);
        }
      }
    }
    else if ((log_global_mask[3] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x165,(void *)0x0,0,
               "Updating global config failed");
    }
    if (log._24_8_ != 0) {
      cfg_db_remove((cfg_db *)log._24_8_);
    }
    abuf_free((autobuf *)local_110);
    old_db._4_4_ = local_114;
  }
  else {
    if ((log_global_mask[3] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,LOG_CONFIG,"src/libcore/oonf_cfg.c",0x15a,(void *)0x0,0,
               "Not enough memory for logging autobuffer");
    }
    old_db._4_4_ = -1;
  }
  return old_db._4_4_;
}

Assistant:

int
oonf_cfg_apply(void) {
  struct cfg_db *old_db;
  struct autobuf log;
  int result;

  if (abuf_init(&log)) {
    OONF_WARN(LOG_CONFIG, "Not enough memory for logging autobuffer");
    return -1;
  }

  OONF_INFO(LOG_CONFIG, "Apply configuration");

  /*** phase 1: activate all plugins ***/
  result = -1;
  old_db = NULL;

  if (oonf_cfg_update_globalcfg(true)) {
    OONF_WARN(LOG_CONFIG, "Updating global config failed");
    goto apply_failed;
  }

  if (oonf_cfg_load_subsystems()) {
    goto apply_failed;
  }

  /*** phase 2: check configuration and apply it ***/
  /* validate configuration data */
  if (cfg_schema_validate(_oonf_raw_db, false, !config_global.failfast, &log)) {
    OONF_WARN(LOG_CONFIG, "Configuration validation failed: %s", abuf_getptr(&log));
    goto apply_failed;
  }

  /* backup old db */
  old_db = _oonf_work_db;

  /* create new configuration database with correct values */
  _oonf_work_db = cfg_db_duplicate(_oonf_raw_db);
  if (_oonf_work_db == NULL) {
    OONF_WARN(LOG_CONFIG, "Not enough memory for duplicating work db");
    _oonf_work_db = old_db;
    old_db = NULL;
    goto apply_failed;
  }

  /* bind schema */
  cfg_db_link_schema(_oonf_work_db, &_oonf_schema);

  /* remove everything not valid */
  cfg_schema_validate(_oonf_work_db, true, false, NULL);

  if (oonf_cfg_update_globalcfg(false)) {
    /* this should not happen at all */
    OONF_WARN(LOG_CONFIG, "Updating global config failed");
    goto apply_failed;
  }

  /* calculate delta and call handlers */
  if (_first_apply) {
    if (cfg_schema_handle_db_startup_changes(_oonf_work_db)) {
      OONF_WARN(LOG_CONFIG, "Handling changes failes");
    }
    _first_apply = false;
  }
  else {
    if (cfg_schema_handle_db_changes(old_db, _oonf_work_db)) {
      OONF_WARN(LOG_CONFIG, "Handling changes failes");
    }
  }

  /* success */
  result = 0;
  _trigger_reload = false;
  _trigger_commit = false;

  /* now get a new working copy of the committed settings */
  cfg_db_remove(_oonf_raw_db);
  _oonf_raw_db = cfg_db_duplicate(_oonf_work_db);
  cfg_db_link_schema(_oonf_raw_db, &_oonf_schema);

apply_failed:
  if (old_db) {
    cfg_db_remove(old_db);
  }

  abuf_free(&log);
  return result;
}